

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::section(Internal *this,char *title)

{
  long lVar1;
  size_t sVar2;
  char *__s;
  size_t sVar3;
  char *in_RSI;
  Internal *in_RDI;
  int i;
  undefined8 in_stack_ffffffffffffffd8;
  undefined1 bright;
  int local_14;
  
  bright = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  if ((in_RDI->opts).quiet == 0) {
    lVar1 = (in_RDI->stats).sections;
    (in_RDI->stats).sections = lVar1 + 1;
    if ((lVar1 != 0) && (in_RDI->internal != (Internal *)0x0)) {
      message(in_RDI);
    }
    print_prefix((Internal *)0xdd1c76);
    Terminal::blue((Terminal *)in_RDI,(bool)bright);
    fputs("--- [ ",_stdout);
    Terminal::blue((Terminal *)in_RDI,(bool)bright);
    fputs(in_RSI,_stdout);
    Terminal::blue((Terminal *)in_RDI,(bool)bright);
    fputs(" ] ",_stdout);
    sVar2 = strlen(in_RSI);
    __s = (char *)std::__cxx11::string::c_str();
    sVar3 = strlen(__s);
    for (local_14 = (int)sVar2 + (int)sVar3 + 9; local_14 < 0x4e; local_14 = local_14 + 1) {
      fputc(0x2d,_stdout);
    }
    Terminal::normal((Terminal *)0xdd1d50);
    fputc(10,_stdout);
    if (in_RDI->internal != (Internal *)0x0) {
      message(in_RDI);
    }
  }
  return;
}

Assistant:

void Internal::section (const char *title) {
#ifdef LOGGING
  if (!opts.log)
#endif
    if (opts.quiet)
      return;
  if (stats.sections++)
    MSG ();
  print_prefix ();
  tout.blue ();
  fputs ("--- [ ", stdout);
  tout.blue (true);
  fputs (title, stdout);
  tout.blue ();
  fputs (" ] ", stdout);
  for (int i = strlen (title) + strlen (prefix.c_str ()) + 9; i < 78; i++)
    fputc ('-', stdout);
  tout.normal ();
  fputc ('\n', stdout);
  MSG ();
}